

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Environment *this;
  RefData<vk::Handle<(vk::HandleType)18>_> data;
  ulong __n;
  TestContext *pTVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  Unique<vk::Handle<(vk::HandleType)18>_> *this_01;
  reference this_02;
  allocator<char> local_339;
  string local_338;
  undefined1 local_311;
  Move<vk::Handle<(vk::HandleType)18>_> local_310;
  RefData<vk::Handle<(vk::HandleType)18>_> local_2f0;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> local_2d0;
  uint local_2bc;
  char *pcStack_2b8;
  deUint32 ndx;
  MessageBuilder local_2b0;
  undefined4 local_130;
  deUint32 watchdogInterval;
  allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_> local_119;
  undefined1 local_118 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  objects;
  Resources res;
  Environment env;
  deUint32 numObjects;
  Context *context_local;
  TestStatus *local_10;
  
  local_10 = __return_storage_ptr__;
  env._52_4_ = ComputePipeline::getMaxConcurrent(context,(Parameters *)((long)&context_local + 7));
  this = (Environment *)
         &res.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
          m_allocator;
  Environment::Environment(this,context,env._52_4_);
  ComputePipeline::Resources::Resources
            ((Resources *)
             &objects.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this,
             (Parameters *)((long)&context_local + 7));
  __n = (ulong)(uint)env._52_4_;
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>::
  allocator(&local_119);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
            *)local_118,__n,&local_119);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>::
  ~allocator(&local_119);
  local_130 = 0x400;
  pTVar1 = Context::getTestContext(context);
  this_00 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_2b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_2b0,(char (*) [10])"Creating ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&env.field_0x34);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x13b8ff9);
  pcStack_2b8 = ::vk::getTypeName<vk::Handle<(vk::HandleType)18>>();
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xfffffffffffffd48);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])0x13837bb);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2b0);
  for (local_2bc = 0; local_2bc < (uint)env._52_4_; local_2bc = local_2bc + 1) {
    this_01 = (Unique<vk::Handle<(vk::HandleType)18>_> *)operator_new(0x20);
    local_311 = 1;
    ComputePipeline::create
              (&local_310,
               (Environment *)
               &res.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
                deleter.m_allocator,
               (Resources *)
               &objects.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (Parameters *)((long)&context_local + 7));
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_2f0,(Move *)&local_310);
    data.deleter.m_deviceIface = local_2f0.deleter.m_deviceIface;
    data.object.m_internal = local_2f0.object.m_internal;
    data.deleter.m_device = local_2f0.deleter.m_device;
    data.deleter.m_allocator = local_2f0.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique(this_01,data);
    local_311 = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::SharedPtr
              (&local_2d0,this_01);
    this_02 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                            *)local_118,(ulong)local_2bc);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator=
              (this_02,&local_2d0);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::~SharedPtr(&local_2d0);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_310);
    if ((local_2bc != 0) && ((local_2bc & 0x3ff) == 0)) {
      pTVar1 = Context::getTestContext(context);
      tcu::TestContext::touchWatchdog(pTVar1);
    }
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::clear((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
           *)local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"Ok",&local_339);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
             *)local_118);
  ComputePipeline::Resources::~Resources
            ((Resources *)
             &objects.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}